

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Q3BSPFileImporter::createMaterials
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  char cVar1;
  pointer __src;
  Q3BSPFileImporter *pQVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  aiMaterial **ppaVar6;
  aiMaterial *this_00;
  long lVar7;
  Logger *this_01;
  _Base_ptr p_Var8;
  aiTexture **__dest;
  aiScene *paVar9;
  ulong uVar10;
  size_t __n;
  undefined2 local_4ea;
  Q3BSPFileImporter *local_4e8;
  Q3BSPModel *local_4e0;
  aiScene *local_4d8;
  int local_4d0;
  int local_4cc;
  string tmp2;
  string texName;
  string matName;
  string tmp1;
  aiString aiMatName;
  
  uVar10 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar10 != 0) {
    local_4e0 = pModel;
    ppaVar6 = (aiMaterial **)operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 << 3);
    pScene->mMaterials = ppaVar6;
    aiMatName.length = 0;
    aiMatName.data[0] = '\0';
    local_4d8 = pScene;
    memset(aiMatName.data + 1,0x1b,0x3ff);
    local_4e8 = this;
    for (p_Var8 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        paVar9 = local_4d8, pQVar2 = local_4e8,
        (_Rb_tree_header *)p_Var8 != &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header
        ; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      std::__cxx11::string::string((string *)&matName,(string *)(p_Var8 + 1));
      sVar3 = matName._M_string_length;
      if (matName._M_string_length != 0) {
        if (matName._M_string_length < 0x400) {
          aiMatName.length = (ai_uint32)matName._M_string_length;
          memcpy(aiMatName.data,matName._M_dataplus._M_p,matName._M_string_length);
          aiMatName.data[sVar3] = '\0';
        }
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        aiMaterial::AddProperty(this_00,&aiMatName,"?mat.name",0,0);
        if (matName._M_string_length != 0) {
          lVar7 = std::__cxx11::string::find((char *)&matName,0x5a5d1e);
          if (lVar7 != -1) {
            std::__cxx11::string::substr((ulong)&tmp1,(ulong)&matName);
            std::__cxx11::string::substr((ulong)&tmp2,(ulong)&matName);
            iVar5 = atoi(tmp1._M_dataplus._M_p);
            local_4cc = atoi(tmp2._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&tmp2);
            std::__cxx11::string::~string((string *)&tmp1);
            if ((iVar5 != -1) &&
               (paVar9 = (aiScene *)
                         (local_4e0->m_Textures).
                         super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(long *)(&paVar9->mFlags + (long)iVar5 * 2) != 0)) {
              local_4d0 = iVar5;
              std::__cxx11::string::string((string *)&tmp2,"*",(allocator *)&tmp1);
              std::__cxx11::string::string((string *)&texName,"",(allocator *)&tmp1);
              std::__cxx11::string::append((char *)&tmp2);
              std::__cxx11::string::append((char *)&tmp2);
              std::__cxx11::string::assign((char *)&texName);
              if (tmp2._M_string_length != 0) {
                std::__cxx11::string::string((string *)&tmp1,"/",(allocator *)&local_4ea);
                local_4ea = 0x5c2f;
                std::__cxx11::string::_M_assign((string *)&texName);
                for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
                  cVar1 = *(char *)((long)&local_4ea + lVar7);
                  paVar9 = (aiScene *)CONCAT71((int7)((ulong)paVar9 >> 8),cVar1);
                  for (uVar10 = 0; uVar10 < texName._M_string_length; uVar10 = uVar10 + 1) {
                    if (texName._M_dataplus._M_p[uVar10] == cVar1) {
                      texName._M_dataplus._M_p[uVar10] = *tmp1._M_dataplus._M_p;
                    }
                  }
                }
                std::__cxx11::string::~string((string *)&tmp1);
              }
              bVar4 = importTextureFromArchive
                                (local_4e8,local_4e0,pArchive,paVar9,this_00,local_4d0);
              if (!bVar4) {
                this_01 = DefaultLogger::get();
                std::operator+(&tmp1,"Cannot import texture from archive ",&texName);
                Logger::error(this_01,tmp1._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&tmp1);
              }
              std::__cxx11::string::~string((string *)&texName);
              std::__cxx11::string::~string((string *)&tmp2);
            }
            if (local_4cc != -1) {
              importLightmap(local_4e8,local_4e0,local_4d8,this_00,local_4cc);
            }
          }
        }
        local_4d8->mMaterials[local_4d8->mNumMaterials] = this_00;
        local_4d8->mNumMaterials = local_4d8->mNumMaterials + 1;
      }
      std::__cxx11::string::~string((string *)&matName);
    }
    uVar10 = (long)(local_4e8->mTextures).
                   super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_4e8->mTextures).
                   super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_4d8->mNumTextures = (uint)(uVar10 >> 3);
    __dest = (aiTexture **)operator_new__(uVar10 & 0x7fffffff8);
    paVar9->mTextures = __dest;
    __src = (pQVar2->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pQVar2->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createMaterials( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if ( m_MaterialLookupMap.empty() ) {
        return;
    }

    pScene->mMaterials = new aiMaterial*[ m_MaterialLookupMap.size() ];
    aiString aiMatName;
    int textureId( -1 ), lightmapId( -1 );
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end();
        ++it ) {
        const std::string matName( it->first );
        if ( matName.empty() ) {
            continue;
        }

        aiMatName.Set( matName );
        aiMaterial *pMatHelper = new aiMaterial;
        pMatHelper->AddProperty( &aiMatName, AI_MATKEY_NAME );

        extractIds( matName, textureId, lightmapId );

        // Adding the texture
        if ( -1 != textureId ) {
            sQ3BSPTexture *pTexture = pModel->m_Textures[ textureId ];
            if ( nullptr != pTexture ) {
                std::string tmp( "*" ), texName( "" );
                tmp += pTexture->strName;
                tmp += ".jpg";
                normalizePathName( tmp, texName );

                if ( !importTextureFromArchive( pModel, pArchive, pScene, pMatHelper, textureId ) ) {
                    ASSIMP_LOG_ERROR("Cannot import texture from archive " + texName);
                }
            }

        }
        if ( -1 != lightmapId )
        {
            importLightmap( pModel, pScene, pMatHelper, lightmapId );
        }
        pScene->mMaterials[ pScene->mNumMaterials ] = pMatHelper;
        pScene->mNumMaterials++;
    }
    pScene->mNumTextures = static_cast<unsigned int>(mTextures.size());
    pScene->mTextures = new aiTexture*[ pScene->mNumTextures ];
    std::copy( mTextures.begin(), mTextures.end(), pScene->mTextures );
}